

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

int32_t uset_getItem_63(USet *uset,int32_t itemIndex,UChar32 *start,UChar32 *end,UChar *str,
                       int32_t strCapacity,UErrorCode *ec)

{
  UBool UVar1;
  UChar32 UVar2;
  int iVar3;
  int32_t iVar4;
  UnicodeString *this;
  Char16Ptr local_60;
  UnicodeString *local_58;
  UnicodeString *s;
  UnicodeSet *pUStack_48;
  int32_t rangeCount;
  UnicodeSet *set;
  UChar *pUStack_38;
  int32_t strCapacity_local;
  UChar *str_local;
  UChar32 *end_local;
  UChar32 *start_local;
  UnicodeSet *pUStack_18;
  int32_t itemIndex_local;
  USet *uset_local;
  
  set._4_4_ = strCapacity;
  pUStack_38 = str;
  str_local = (UChar *)end;
  end_local = start;
  start_local._4_4_ = itemIndex;
  pUStack_18 = (UnicodeSet *)uset;
  UVar1 = U_FAILURE(*ec);
  iVar3 = start_local._4_4_;
  if (UVar1 == '\0') {
    pUStack_48 = pUStack_18;
    if (start_local._4_4_ < 0) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      uset_local._4_4_ = -1;
    }
    else {
      s._4_4_ = icu_63::UnicodeSet::getRangeCount(pUStack_18);
      if (iVar3 < s._4_4_) {
        UVar2 = icu_63::UnicodeSet::getRangeStart(pUStack_48,start_local._4_4_);
        *end_local = UVar2;
        UVar2 = icu_63::UnicodeSet::getRangeEnd(pUStack_48,start_local._4_4_);
        *(UChar32 *)str_local = UVar2;
        uset_local._4_4_ = 0;
      }
      else {
        iVar3 = start_local._4_4_ - s._4_4_;
        start_local._4_4_ = iVar3;
        iVar4 = icu_63::USetAccess::getStringCount(pUStack_48);
        if (iVar3 < iVar4) {
          this = icu_63::USetAccess::getString(pUStack_48,start_local._4_4_);
          local_58 = this;
          icu_63::Char16Ptr::Char16Ptr(&local_60,pUStack_38);
          uset_local._4_4_ = icu_63::UnicodeString::extract(this,&local_60,set._4_4_,ec);
          icu_63::Char16Ptr::~Char16Ptr(&local_60);
        }
        else {
          *ec = U_INDEX_OUTOFBOUNDS_ERROR;
          uset_local._4_4_ = -1;
        }
      }
    }
  }
  else {
    uset_local._4_4_ = 0;
  }
  return uset_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uset_getItem(const USet* uset, int32_t itemIndex,
             UChar32* start, UChar32* end,
             UChar* str, int32_t strCapacity,
             UErrorCode* ec) {
    if (U_FAILURE(*ec)) return 0;
    const UnicodeSet& set = *(const UnicodeSet*)uset;
    int32_t rangeCount;

    if (itemIndex < 0) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    } else if (itemIndex < (rangeCount = set.getRangeCount())) {
        *start = set.getRangeStart(itemIndex);
        *end = set.getRangeEnd(itemIndex);
        return 0;
    } else {
        itemIndex -= rangeCount;
        if (itemIndex < USetAccess::getStringCount(set)) {
            const UnicodeString* s = USetAccess::getString(set, itemIndex);
            return s->extract(str, strCapacity, *ec);
        } else {
            *ec = U_INDEX_OUTOFBOUNDS_ERROR;
            return -1;
        }
    }
}